

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Aig_Man_t * Dar_ManBalance(Aig_Man_t *p,int fUpdateLevel)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Vec_Vec_t *vStore;
  void **ppvVar12;
  Aig_Obj_t *pAVar13;
  Aig_Obj_t *pAVar14;
  Tim_Man_t *pTVar15;
  void *pvVar16;
  Vec_Ptr_t *pVVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  float fVar21;
  
  iVar5 = Aig_ManVerifyTopoOrder(p);
  if (iVar5 == 0) {
    __assert_fail("Aig_ManVerifyTopoOrder(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x230,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  iVar5 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar5;
  p_00->nBarBufs = p->nBarBufs;
  p_00->Time2Quit = p->Time2Quit;
  pVVar3 = p->vFlopNums;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar3->nSize;
    pVVar10->nSize = iVar5;
    pVVar10->nCap = iVar5;
    if ((long)iVar5 == 0) {
      sVar8 = 0;
      piVar11 = (int *)0x0;
    }
    else {
      sVar8 = (long)iVar5 << 2;
      piVar11 = (int *)malloc(sVar8);
    }
    pVVar10->pArray = piVar11;
    memcpy(piVar11,pVVar3->pArray,sVar8);
    p_00->vFlopNums = pVVar10;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  vStore = (Vec_Vec_t *)malloc(0x10);
  vStore->nCap = 0x32;
  vStore->nSize = 0;
  ppvVar12 = (void **)malloc(400);
  vStore->pArray = ppvVar12;
  if ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) {
    pVVar17 = p->vCis;
    if (0 < pVVar17->nSize) {
      lVar19 = 0;
      do {
        pvVar16 = pVVar17->pArray[lVar19];
        pAVar13 = Aig_ObjCreateCi(p_00);
        *(ulong *)&pAVar13->field_0x18 =
             *(ulong *)&pAVar13->field_0x18 & 0xff000000ffffffff |
             *(ulong *)((long)pvVar16 + 0x18) & 0xffffff00000000;
        *(Aig_Obj_t **)((long)pvVar16 + 0x28) = pAVar13;
        lVar19 = lVar19 + 1;
        pVVar17 = p->vCis;
      } while (lVar19 < pVVar17->nSize);
    }
    if (p->nBarBufs == 0) {
      pVVar17 = p->vCos;
      if (0 < pVVar17->nSize) {
        lVar19 = 0;
LAB_0048e70a:
        pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pVVar17->pArray[lVar19] + 8));
        pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),vStore,0,
                                  fUpdateLevel);
        if (pAVar14 != (Aig_Obj_t *)0x0) goto code_r0x0048e742;
        iVar5 = vStore->nSize;
        ppvVar12 = vStore->pArray;
        if (0 < (long)iVar5) {
          lVar19 = 0;
          do {
            pvVar16 = ppvVar12[lVar19];
            if (pvVar16 != (void *)0x0) {
              if (*(void **)((long)pvVar16 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar16 + 8));
              }
              free(pvVar16);
            }
            lVar19 = lVar19 + 1;
          } while (iVar5 != lVar19);
          goto LAB_0048e96f;
        }
        goto joined_r0x0048e9a0;
      }
    }
    else {
      iVar5 = p->nObjs[3];
      iVar7 = 8;
      if (6 < iVar5 - 1U) {
        iVar7 = iVar5;
      }
      if (iVar7 == 0) {
        pvVar16 = (void *)0x0;
      }
      else {
        pvVar16 = malloc((long)iVar7 << 3);
      }
      iVar18 = 0;
      memset(pvVar16,0,(long)iVar5 * 8);
      pVVar17 = p->vCos;
      iVar7 = pVVar17->nSize;
      if (0 < iVar7) {
        while( true ) {
          iVar1 = p->nBarBufs;
          iVar20 = -iVar1;
          if (iVar18 < iVar1) {
            iVar20 = p->nObjs[3] - iVar1;
          }
          uVar6 = iVar18 + iVar20;
          if (((int)uVar6 < 0) || (iVar7 <= (int)uVar6)) goto LAB_0048e9a4;
          pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pVVar17->pArray[uVar6] + 8));
          pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),vStore,0
                                    ,fUpdateLevel);
          if (pAVar14 == (Aig_Obj_t *)0x0) break;
          if (iVar5 <= (int)uVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          *(ulong *)((long)pvVar16 + (ulong)uVar6 * 8) = (ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14
          ;
          if (iVar18 < p->nBarBufs) {
            uVar6 = (p->nObjs[2] - p->nBarBufs) + iVar18;
            if (((int)uVar6 < 0) || (p_00->vCis->nSize <= (int)uVar6)) goto LAB_0048e9a4;
            pvVar4 = p_00->vCis->pArray[uVar6];
            *(ulong *)((long)pvVar4 + 0x18) =
                 *(ulong *)((long)pvVar4 + 0x18) & 0xff000000ffffffff |
                 *(ulong *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x18) & 0xffffff00000000;
          }
          iVar18 = iVar18 + 1;
          pVVar17 = p->vCos;
          iVar7 = pVVar17->nSize;
          if (iVar7 <= iVar18) goto code_r0x0048e890;
        }
        iVar5 = vStore->nSize;
        ppvVar12 = vStore->pArray;
        if (0 < (long)iVar5) {
          lVar19 = 0;
          do {
            pvVar16 = ppvVar12[lVar19];
            if (pvVar16 != (void *)0x0) {
              if (*(void **)((long)pvVar16 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar16 + 8));
              }
              free(pvVar16);
            }
            lVar19 = lVar19 + 1;
          } while (iVar5 != lVar19);
          goto LAB_0048e96f;
        }
joined_r0x0048e9a0:
        if (ppvVar12 != (void **)0x0) {
LAB_0048e96f:
          free(ppvVar12);
        }
        free(vStore);
LAB_0048e981:
        Aig_ManStop(p_00);
        return (Aig_Man_t *)0x0;
      }
      if (pvVar16 != (void *)0x0) goto LAB_0048e8c9;
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    Aig_ManSetCioIds(p);
    pVVar17 = p->vObjs;
    if (0 < pVVar17->nSize) {
      lVar19 = 0;
      do {
        piVar11 = (int *)pVVar17->pArray[lVar19];
        if ((piVar11 != (int *)0x0) && (((uint)*(undefined8 *)(piVar11 + 6) & 7) - 7 < 0xfffffffe))
        {
          if (((ulong)piVar11 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          uVar6 = (uint)*(undefined8 *)(piVar11 + 6) & 7;
          if (uVar6 != 1) {
            if (uVar6 == 3) {
              pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)(piVar11 + 2));
              pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),
                                        vStore,0,fUpdateLevel);
              if (pAVar14 == (Aig_Obj_t *)0x0) {
                Vec_VecFree(vStore);
                goto LAB_0048e981;
              }
              if (0xfffffffd < (piVar11[6] & 7U) - 7) goto LAB_0048e9e2;
              Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,*piVar11,
                                  (float)(*(uint *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x1c) &
                                         0xffffff));
              Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14));
            }
            else {
              if (uVar6 != 2) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                              ,0x264,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
              }
              pAVar13 = Aig_ObjCreateCi(p_00);
              *(Aig_Obj_t **)(piVar11 + 10) = pAVar13;
              if (0xfffffffd < (piVar11[6] & 7U) - 7) {
LAB_0048e9e2:
                __assert_fail("!Aig_ObjIsNode(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
              }
              fVar21 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,*piVar11);
              *(ulong *)&pAVar13->field_0x18 =
                   *(ulong *)&pAVar13->field_0x18 & 0xff000000ffffffff |
                   (ulong)((int)fVar21 & 0xffffff) << 0x20;
            }
          }
        }
        lVar19 = lVar19 + 1;
        pVVar17 = p->vObjs;
      } while (lVar19 < pVVar17->nSize);
    }
    Aig_ManCleanCioIds(p);
    pTVar15 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar15;
  }
  goto LAB_0048e5cc;
code_r0x0048e742:
  Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14));
  lVar19 = lVar19 + 1;
  pVVar17 = p->vCos;
  if (pVVar17->nSize <= lVar19) goto LAB_0048e5cc;
  goto LAB_0048e70a;
code_r0x0048e890:
  if (0 < iVar7) {
    lVar19 = 0;
    do {
      if (iVar5 == lVar19) {
LAB_0048e9a4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar16 + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (lVar19 < p->vCos->nSize);
  }
LAB_0048e8c9:
  free(pvVar16);
LAB_0048e5cc:
  iVar5 = vStore->nSize;
  ppvVar12 = vStore->pArray;
  if ((long)iVar5 < 1) {
    if (ppvVar12 == (void **)0x0) goto LAB_0048e6ba;
  }
  else {
    lVar19 = 0;
    do {
      pvVar16 = ppvVar12[lVar19];
      if (pvVar16 != (void *)0x0) {
        if (*(void **)((long)pvVar16 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar16 + 8));
        }
        free(pvVar16);
      }
      lVar19 = lVar19 + 1;
    } while (iVar5 != lVar19);
  }
  free(ppvVar12);
LAB_0048e6ba:
  free(vStore);
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar5 = Aig_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Dar_ManBalance(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Dar_ManBalance( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pDriver, * pObjNew;
    Vec_Vec_t * vStore;
    int i;
    assert( Aig_ManVerifyTopoOrder(p) );
    // create the new manager 
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    pNew->Time2Quit = p->Time2Quit;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the PI nodes
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    vStore = Vec_VecAlloc( 50 );
    if ( p->pManTime != NULL )
    {
        float arrTime;
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Aig_ManSetCioIds( p );
        Aig_ManForEachObj( p, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
                continue;
            if ( Aig_ObjIsCi(pObj) )
            {
                // copy the PI
                pObjNew = Aig_ObjCreateCi(pNew); 
                pObj->pData = pObjNew;
                // set the arrival time of the new PI
                arrTime = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                pObjNew->Level = (int)arrTime;
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                // perform balancing
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                // save arrival time of the output
                arrTime = (float)Aig_Regular(pObjNew)->Level;
                Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj), arrTime );
                // create PO
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
            else
                assert( 0 );
        }
        Aig_ManCleanCioIds( p );
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    }
    else
    {
        Aig_ManForEachCi( p, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pNew); 
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        if ( p->nBarBufs == 0 )
        {
            Aig_ManForEachCo( p, pObj, i )
            {
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
        }
        else
        {
            Vec_Ptr_t * vLits = Vec_PtrStart( Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
            {
                int k = i < p->nBarBufs ? Aig_ManCoNum(p) - p->nBarBufs + i : i - p->nBarBufs;
                pObj = Aig_ManCo( p, k );
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                Vec_PtrWriteEntry( vLits, k, pObjNew );
                if ( i < p->nBarBufs )
                    Aig_ManCi(pNew, Aig_ManCiNum(p) - p->nBarBufs + i)->Level = Aig_Regular(pObjNew)->Level;
            }
            Aig_ManForEachCo( p, pObj, i )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vLits, i) );
            Vec_PtrFree(vLits);
        }
    }
    Vec_VecFree( vStore );
    // remove dangling nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting AIG
    if ( !Aig_ManCheck(pNew) )
        printf( "Dar_ManBalance(): The check has failed.\n" );
    return pNew;
}